

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::Transaction::AddTxIn
          (Transaction *this,Txid *txid,uint32_t index,uint32_t sequence,Script *unlocking_script)

{
  bool bVar1;
  uint uVar2;
  CfdException *this_00;
  undefined8 uVar3;
  size_type sVar4;
  string *message;
  CfdError error_code;
  TxIn local_198;
  undefined1 local_108 [8];
  TxIn txin;
  undefined1 local_61 [33];
  CfdSourceLocation local_40;
  Script *local_28;
  Script *unlocking_script_local;
  uint32_t sequence_local;
  uint32_t index_local;
  Txid *txid_local;
  Transaction *this_local;
  
  local_28 = unlocking_script;
  unlocking_script_local._0_4_ = sequence;
  unlocking_script_local._4_4_ = index;
  _sequence_local = txid;
  txid_local = (Txid *)this;
  this_00 = (CfdException *)
            ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
  uVar2 = ::std::numeric_limits<unsigned_int>::max();
  if (this_00 == (CfdException *)(ulong)uVar2) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)this >> 0x20);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x234;
    local_40.funcname = "AddTxIn";
    logger::warn<>(&local_40,"vin maximum.");
    txin.super_AbstractTxIn.script_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    message = (string *)local_61;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(local_61 + 1),"txin maximum.",(allocator *)message);
    CfdException::CfdException(this_00,error_code,message);
    txin.super_AbstractTxIn.script_witness_.witness_stack_.
    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AbstractTransaction::AddTxIn
            (&this->super_AbstractTransaction,_sequence_local,unlocking_script_local._4_4_,
             (uint32_t)unlocking_script_local,local_28);
  TxIn::TxIn((TxIn *)local_108,_sequence_local,unlocking_script_local._4_4_,
             (uint32_t)unlocking_script_local);
  bVar1 = Script::IsEmpty(local_28);
  if (!bVar1) {
    TxIn::TxIn(&local_198,_sequence_local,unlocking_script_local._4_4_,
               (uint32_t)unlocking_script_local,local_28);
    TxIn::operator=((TxIn *)local_108,&local_198);
    TxIn::~TxIn((TxIn *)0x436ae2);
  }
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back
            (&this->vin_,(value_type *)local_108);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,1);
  sVar4 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
  TxIn::~TxIn((TxIn *)0x436b62);
  return (int)sVar4 - 1;
}

Assistant:

uint32_t Transaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  AbstractTransaction::AddTxIn(txid, index, sequence, unlocking_script);
  TxIn txin(txid, index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = TxIn(txid, index, sequence, unlocking_script);
  }

  vin_.push_back(txin);

  CallbackStateChange(kStateChangeAddTxIn);
  return static_cast<uint32_t>(vin_.size() - 1);
}